

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O2

void __thiscall Liby::Socket::Socket(Socket *this,fdPtr *fp,bool isUdp_)

{
  this->isUdp_ = isUdp_;
  this->fd_ = ((fp->super___shared_ptr<Liby::FileDescriptor,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
              fd_;
  std::__shared_ptr<Liby::FileDescriptor,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&(this->fp_).super___shared_ptr<Liby::FileDescriptor,_(__gnu_cxx::_Lock_policy)2>,
             &fp->super___shared_ptr<Liby::FileDescriptor,_(__gnu_cxx::_Lock_policy)2>);
  (this->ep_).port_ = 0;
  (this->ep_).addr_ = 0;
  return;
}

Assistant:

Socket::Socket(const fdPtr &fp, bool isUdp_)
    : isUdp_(isUdp_), fd_(fp->fd()), fp_(fp) {}